

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum_Base.h
# Opt level: O2

uint32_t Hacl_Bignum_Lib_bn_get_bits_u32(uint32_t len,uint32_t *b,uint32_t i,uint32_t l)

{
  uint uVar1;
  sbyte sVar2;
  uint uVar3;
  
  sVar2 = (sbyte)(i & 0x1f);
  uVar1 = b[i >> 5] >> sVar2;
  uVar3 = (i >> 5) + 1;
  if ((i & 0x1f) != 0 && uVar3 < len) {
    uVar1 = uVar1 | b[uVar3] << (-sVar2 & 0x1fU);
  }
  return uVar1 & 0xf;
}

Assistant:

static inline uint32_t
Hacl_Bignum_Lib_bn_get_bits_u32(uint32_t len, uint32_t *b, uint32_t i, uint32_t l)
{
  uint32_t i1 = i / 32U;
  uint32_t j = i % 32U;
  uint32_t p1 = b[i1] >> j;
  uint32_t ite;
  if (i1 + 1U < len && 0U < j)
  {
    ite = p1 | b[i1 + 1U] << (32U - j);
  }
  else
  {
    ite = p1;
  }
  return ite & ((1U << l) - 1U);
}